

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

bool __thiscall anon_unknown.dwarf_625c4::CLIncludeParser::ProcessLine(CLIncludeParser *this)

{
  string_view *psVar1;
  ofstream *poVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  char *__s;
  string_view str;
  string path;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  path local_40;
  
  local_40._M_pathname._M_string_length = (size_type)(this->super_LineParser).Line._M_dataplus._M_p;
  local_40._M_pathname._M_dataplus._M_p = (pointer)(this->super_LineParser).Line._M_string_length;
  psVar1 = &this->IncludePrefix;
  __str._M_len = psVar1->_M_len;
  __str._M_str = psVar1->_M_str;
  iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_40,0,psVar1->_M_len,
                     __str);
  if (iVar3 == 0) {
    __s = (this->super_LineParser).Line._M_dataplus._M_p + (this->IncludePrefix)._M_len;
    sVar5 = strlen(__s);
    str._M_str = __s;
    str._M_len = sVar5;
    cmTrimWhitespace_abi_cxx11_(&local_60,str);
    cmSystemTools::ConvertToLongPath(&local_60);
    poVar2 = this->DepFile;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_40,&local_a0,generic_format);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_80,&local_40,&local_a1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                        local_80._M_dataplus._M_p,local_80._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->Output,(this->super_LineParser).Line._M_dataplus._M_p,
                        (this->super_LineParser).Line._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (cmHasPrefix(this->Line, this->IncludePrefix)) {
      auto path =
        cmTrimWhitespace(this->Line.c_str() + this->IncludePrefix.size());
      cmSystemTools::ConvertToLongPath(path);
      this->DepFile << cmCMakePath(path).GenericString() << std::endl;
    } else {
      this->Output << this->Line << std::endl << std::flush;
    }

    return true;
  }